

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O2

void Imf_2_5::anon_unknown_0::outputBits(int nBits,Int64 bits,Int64 *c,int *lc,char **out)

{
  Int64 IVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  
  IVar1 = *c;
  iVar4 = nBits + *lc;
  *lc = iVar4;
  *c = IVar1 << ((byte)nBits & 0x3f) | bits;
  while (7 < iVar4) {
    uVar2 = *c;
    *lc = iVar4 + -8;
    pcVar3 = *out;
    *out = pcVar3 + 1;
    *pcVar3 = (char)(uVar2 >> ((byte)(iVar4 + -8) & 0x3f));
    iVar4 = *lc;
  }
  return;
}

Assistant:

inline void
outputBits (int nBits, Int64 bits, Int64 &c, int &lc, char *&out)
{
    c <<= nBits;
    lc += nBits;

    c |= bits;

    while (lc >= 8)
	*out++ = (c >> (lc -= 8));
}